

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_create(hsts *h,char *hostname,_Bool subdomains,curl_off_t expires)

{
  void *ne;
  void *pvVar1;
  stsentry *sts;
  char *duphost;
  size_t hlen;
  curl_off_t expires_local;
  _Bool subdomains_local;
  char *hostname_local;
  hsts *h_local;
  
  duphost = (char *)strlen(hostname);
  if ((duphost != (char *)0x0) && (hostname[(long)(duphost + -1)] == '.')) {
    duphost = duphost + -1;
  }
  if (duphost != (char *)0x0) {
    ne = (*Curl_ccalloc)(1,0x38);
    if (ne == (void *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pvVar1 = Curl_memdup0(hostname,(size_t)duphost);
    if (pvVar1 == (void *)0x0) {
      (*Curl_cfree)(ne);
      return CURLE_OUT_OF_MEMORY;
    }
    *(void **)((long)ne + 0x20) = pvVar1;
    *(curl_off_t *)((long)ne + 0x30) = expires;
    *(_Bool *)((long)ne + 0x28) = subdomains;
    Curl_llist_append(&h->list,ne,(Curl_llist_node *)ne);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode hsts_create(struct hsts *h,
                            const char *hostname,
                            bool subdomains,
                            curl_off_t expires)
{
  size_t hlen;
  DEBUGASSERT(h);
  DEBUGASSERT(hostname);

  hlen = strlen(hostname);
  if(hlen && (hostname[hlen - 1] == '.'))
    /* strip off any trailing dot */
    --hlen;
  if(hlen) {
    char *duphost;
    struct stsentry *sts = calloc(1, sizeof(struct stsentry));
    if(!sts)
      return CURLE_OUT_OF_MEMORY;

    duphost = Curl_memdup0(hostname, hlen);
    if(!duphost) {
      free(sts);
      return CURLE_OUT_OF_MEMORY;
    }

    sts->host = duphost;
    sts->expires = expires;
    sts->includeSubDomains = subdomains;
    Curl_llist_append(&h->list, sts, &sts->node);
  }
  return CURLE_OK;
}